

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceValidators.cpp
# Opt level: O2

Result * CoreML::validateSizeRange(Result *__return_storage_ptr__,SizeRange *range)

{
  string sStack_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  if ((range->upperbound_ < 1) || (range->lowerbound_ <= (ulong)range->upperbound_)) {
    Result::Result(__return_storage_ptr__);
  }
  else {
    std::__cxx11::to_string(&local_38,range->lowerbound_);
    std::operator+(&local_b8,"Size range is invalid (",&local_38);
    std::operator+(&local_98,&local_b8,", ");
    std::__cxx11::to_string(&sStack_d8,range->upperbound_);
    std::operator+(&local_78,&local_98,&sStack_d8);
    std::operator+(&local_58,&local_78," ).");
    Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&sStack_d8);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

Result validateSizeRange(const Specification::SizeRange &range) {
        if (range.upperbound() > 0 && range.lowerbound() > static_cast<unsigned long long>(range.upperbound())) {
            return Result(ResultType::INVALID_MODEL_INTERFACE,
                          "Size range is invalid (" + std::to_string(range.lowerbound()) + ", " + std::to_string(range.upperbound()) + " ).");
        }
        return Result();
    }